

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_verify_channel_id(SSL_HANDSHAKE *hs,SSLMessage *msg)

{
  undefined1 *puVar1;
  SSL *ssl;
  SSL3_STATE *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  EC_GROUP *group;
  BIGNUM *pBVar12;
  ec_key_st *peVar13;
  uint16_t extension_type;
  UniquePtr<ECDSA_SIG> sig;
  UniquePtr<EC_KEY> key;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  UniquePtr<EC_POINT> point;
  size_t digest_len;
  CBS channel_id;
  CBS extension;
  uint8_t digest [64];
  uint16_t local_ca;
  _Head_base<0UL,_ecdsa_sig_st_*,_false> local_c8;
  _Head_base<0UL,_ec_key_st_*,_false> local_c0;
  _Head_base<0UL,_bignum_st_*,_false> local_b8;
  _Head_base<0UL,_bignum_st_*,_false> local_b0;
  _Head_base<0UL,_ec_point_st_*,_false> local_a8;
  int local_a0 [2];
  CBS local_98;
  CBS local_88;
  uint8_t local_78 [72];
  
  ssl = hs->ssl;
  local_98.data = (msg->body).data;
  local_98.len = (msg->body).len;
  iVar11 = CBS_get_u16(&local_98,&local_ca);
  if ((((iVar11 == 0) || (iVar11 = CBS_get_u16_length_prefixed(&local_98,&local_88), iVar11 == 0))
      || (local_98.len != 0)) || ((local_ca != 0x7550 || (local_88.len != 0x80)))) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x11e1);
    ssl_send_alert(ssl,2,0x32);
    return false;
  }
  group = EC_group_p256();
  local_c8._M_head_impl = (ecdsa_sig_st *)ECDSA_SIG_new();
  local_b0._M_head_impl = (bignum_st *)BN_new();
  local_b8._M_head_impl = (bignum_st *)BN_new();
  if ((((ECDSA_SIG *)local_c8._M_head_impl == (ECDSA_SIG *)0x0) ||
      (((BIGNUM *)local_b0._M_head_impl == (BIGNUM *)0x0 ||
        (BIGNUM *)local_b8._M_head_impl == (BIGNUM *)0x0 ||
       (pBVar12 = BN_bin2bn(local_88.data,0x20,(BIGNUM *)local_b0._M_head_impl),
       pBVar12 == (BIGNUM *)0x0)))) ||
     ((pBVar12 = BN_bin2bn(local_88.data + 0x20,0x20,(BIGNUM *)local_b8._M_head_impl),
      pBVar12 == (BIGNUM *)0x0 ||
      ((pBVar12 = BN_bin2bn(local_88.data + 0x40,0x20,(BIGNUM *)(local_c8._M_head_impl)->r),
       pBVar12 == (BIGNUM *)0x0 ||
       (pBVar12 = BN_bin2bn(local_88.data + 0x60,0x20,(BIGNUM *)(local_c8._M_head_impl)->s),
       pBVar12 == (BIGNUM *)0x0)))))) {
    bVar10 = false;
    goto LAB_0023c7e2;
  }
  peVar13 = (ec_key_st *)EC_KEY_new();
  local_c0._M_head_impl = peVar13;
  local_a8._M_head_impl = (ec_point_st *)EC_POINT_new((EC_GROUP *)group);
  if ((((local_a8._M_head_impl == (ec_point_st *)0x0 || peVar13 == (ec_key_st *)0x0) ||
       (iVar11 = EC_POINT_set_affine_coordinates_GFp
                           ((EC_GROUP *)group,(EC_POINT *)local_a8._M_head_impl,
                            (BIGNUM *)local_b0._M_head_impl,(BIGNUM *)local_b8._M_head_impl,
                            (BN_CTX *)0x0), iVar11 == 0)) ||
      (iVar11 = EC_KEY_set_group((EC_KEY *)local_c0._M_head_impl,(EC_GROUP *)group), iVar11 == 0))
     || ((iVar11 = EC_KEY_set_public_key
                             ((EC_KEY *)local_c0._M_head_impl,(EC_POINT *)local_a8._M_head_impl),
         iVar11 == 0 || (bVar10 = tls1_channel_id_hash(hs,local_78,(size_t *)local_a0), !bVar10))))
  {
LAB_0023c832:
    bVar10 = false;
  }
  else {
    iVar11 = ECDSA_do_verify(local_78,local_a0[0],(ECDSA_SIG *)local_c8._M_head_impl,
                             (EC_KEY *)local_c0._M_head_impl);
    if (iVar11 == 0) {
      ERR_put_error(0x10,0,0x81,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x120b);
      ssl_send_alert(ssl,2,0x33);
      goto LAB_0023c832;
    }
    pSVar2 = ssl->s3;
    uVar3 = *(undefined8 *)local_88.data;
    uVar4 = *(undefined8 *)(local_88.data + 8);
    uVar5 = *(undefined8 *)(local_88.data + 0x10);
    uVar6 = *(undefined8 *)(local_88.data + 0x18);
    uVar7 = *(undefined8 *)(local_88.data + 0x20);
    uVar8 = *(undefined8 *)(local_88.data + 0x28);
    uVar9 = *(undefined8 *)(local_88.data + 0x38);
    *(undefined8 *)(pSVar2->channel_id + 0x30) = *(undefined8 *)(local_88.data + 0x30);
    *(undefined8 *)(pSVar2->channel_id + 0x38) = uVar9;
    *(undefined8 *)(pSVar2->channel_id + 0x20) = uVar7;
    *(undefined8 *)(pSVar2->channel_id + 0x28) = uVar8;
    *(undefined8 *)(pSVar2->channel_id + 0x10) = uVar5;
    *(undefined8 *)(pSVar2->channel_id + 0x18) = uVar6;
    *(undefined8 *)pSVar2->channel_id = uVar3;
    *(undefined8 *)(pSVar2->channel_id + 8) = uVar4;
    puVar1 = &ssl->s3->field_0xdc;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x80;
    bVar10 = true;
  }
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_a8);
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_c0);
LAB_0023c7e2:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_b8);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_b0);
  std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&local_c8);
  return bVar10;
}

Assistant:

bool tls1_verify_channel_id(SSL_HANDSHAKE *hs, const SSLMessage &msg) {
  SSL *const ssl = hs->ssl;
  // A Channel ID handshake message is structured to contain multiple
  // extensions, but the only one that can be present is Channel ID.
  uint16_t extension_type;
  CBS channel_id = msg.body, extension;
  if (!CBS_get_u16(&channel_id, &extension_type) ||             //
      !CBS_get_u16_length_prefixed(&channel_id, &extension) ||  //
      CBS_len(&channel_id) != 0 ||                              //
      extension_type != TLSEXT_TYPE_channel_id ||               //
      CBS_len(&extension) != TLSEXT_CHANNEL_ID_SIZE) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    return false;
  }

  const EC_GROUP *p256 = EC_group_p256();
  UniquePtr<ECDSA_SIG> sig(ECDSA_SIG_new());
  UniquePtr<BIGNUM> x(BN_new()), y(BN_new());
  if (!sig || !x || !y) {
    return false;
  }

  const uint8_t *p = CBS_data(&extension);
  if (BN_bin2bn(p + 0, 32, x.get()) == NULL ||
      BN_bin2bn(p + 32, 32, y.get()) == NULL ||
      BN_bin2bn(p + 64, 32, sig->r) == NULL ||
      BN_bin2bn(p + 96, 32, sig->s) == NULL) {
    return false;
  }

  UniquePtr<EC_KEY> key(EC_KEY_new());
  UniquePtr<EC_POINT> point(EC_POINT_new(p256));
  if (!key || !point ||
      !EC_POINT_set_affine_coordinates_GFp(p256, point.get(), x.get(), y.get(),
                                           nullptr) ||
      !EC_KEY_set_group(key.get(), p256) ||
      !EC_KEY_set_public_key(key.get(), point.get())) {
    return false;
  }

  uint8_t digest[EVP_MAX_MD_SIZE];
  size_t digest_len;
  if (!tls1_channel_id_hash(hs, digest, &digest_len)) {
    return false;
  }

  bool sig_ok = ECDSA_do_verify(digest, digest_len, sig.get(), key.get());
  if (CRYPTO_fuzzer_mode_enabled()) {
    sig_ok = true;
    ERR_clear_error();
  }
  if (!sig_ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CHANNEL_ID_SIGNATURE_INVALID);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECRYPT_ERROR);
    return false;
  }

  OPENSSL_memcpy(ssl->s3->channel_id, p, 64);
  ssl->s3->channel_id_valid = true;
  return true;
}